

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

void place_random_door(chunk_conflict *c,loc grid)

{
  uint32_t uVar1;
  wchar_t tmp;
  chunk_conflict *c_local;
  loc grid_local;
  
  uVar1 = Rand_div(100);
  if ((int)uVar1 < 0x1e) {
    square_set_feat((chunk *)c,(loc_conflict)grid,FEAT_OPEN);
  }
  else if ((int)uVar1 < 0x28) {
    square_set_feat((chunk *)c,(loc_conflict)grid,FEAT_BROKEN);
  }
  else {
    place_closed_door(c,grid);
  }
  return;
}

Assistant:

void place_random_door(struct chunk *c, struct loc grid)
{
	int tmp = randint0(100);

	if (tmp < 30)
		square_set_feat(c, grid, FEAT_OPEN);
	else if (tmp < 40)
		square_set_feat(c, grid, FEAT_BROKEN);
	else
		place_closed_door(c, grid);
}